

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_64x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  ushort uVar63;
  undefined1 auVar64 [15];
  ushort uVar65;
  undefined1 auVar66 [15];
  ushort uVar67;
  undefined1 auVar68 [15];
  ushort uVar69;
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  unkuint9 Var92;
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  unkuint9 Var95;
  undefined1 auVar96 [11];
  undefined1 auVar97 [15];
  unkuint9 Var98;
  undefined1 auVar99 [11];
  undefined1 auVar100 [15];
  unkuint9 Var101;
  undefined1 auVar102 [11];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [16];
  bool bVar112;
  bool bVar113;
  int iVar114;
  long lVar115;
  undefined4 uVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  short sVar119;
  short sVar120;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar135;
  short sVar138;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  short sVar141;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar154 [16];
  undefined1 auVar162 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  short sVar180;
  short sVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  byte bVar133;
  byte bVar134;
  byte bVar136;
  byte bVar137;
  byte bVar139;
  byte bVar140;
  byte bVar142;
  byte bVar147;
  byte bVar148;
  byte bVar149;
  byte bVar150;
  byte bVar151;
  byte bVar152;
  byte bVar153;
  byte bVar155;
  byte bVar156;
  byte bVar157;
  byte bVar158;
  byte bVar159;
  byte bVar160;
  byte bVar161;
  byte bVar163;
  byte bVar164;
  byte bVar165;
  byte bVar166;
  byte bVar167;
  byte bVar168;
  byte bVar169;
  short sVar179;
  short sVar193;
  short sVar222;
  
  auVar117 = *(undefined1 (*) [16])above;
  auVar122 = *(undefined1 (*) [16])(above + 0x10);
  auVar123 = *(undefined1 (*) [16])(above + 0x20);
  auVar124 = *(undefined1 (*) [16])(above + 0x30);
  auVar59[0xd] = 0;
  auVar59._0_13_ = auVar117._0_13_;
  auVar59[0xe] = auVar117[7];
  uVar63 = auVar59._13_2_;
  auVar64[0xc] = auVar117[6];
  auVar64._0_12_ = auVar117._0_12_;
  auVar64._13_2_ = uVar63;
  auVar71[0xb] = 0;
  auVar71._0_11_ = auVar117._0_11_;
  auVar71._12_3_ = auVar64._12_3_;
  auVar75[10] = auVar117[5];
  auVar75._0_10_ = auVar117._0_10_;
  auVar75._11_4_ = auVar71._11_4_;
  auVar79[9] = 0;
  auVar79._0_9_ = auVar117._0_9_;
  auVar79._10_5_ = auVar75._10_5_;
  auVar83[8] = auVar117[4];
  auVar83._0_8_ = auVar117._0_8_;
  auVar83._9_6_ = auVar79._9_6_;
  auVar91._7_8_ = 0;
  auVar91._0_7_ = auVar83._8_7_;
  Var92 = CONCAT81(SUB158(auVar91 << 0x40,7),auVar117[3]);
  auVar103._9_6_ = 0;
  auVar103._0_9_ = Var92;
  auVar93._1_10_ = SUB1510(auVar103 << 0x30,5);
  auVar93[0] = auVar117[2];
  auVar104._11_4_ = 0;
  auVar104._0_11_ = auVar93;
  auVar87[2] = auVar117[1];
  auVar87._0_2_ = auVar117._0_2_;
  auVar87._3_12_ = SUB1512(auVar104 << 0x20,3);
  auVar143._0_2_ = auVar117._0_2_ & 0xff;
  auVar143._2_13_ = auVar87._2_13_;
  auVar143[0xf] = 0;
  auVar154._0_2_ = CONCAT11(0,auVar117[8]);
  bVar155 = auVar117[9];
  auVar154[2] = bVar155;
  auVar154[3] = 0;
  bVar156 = auVar117[10];
  auVar154[4] = bVar156;
  auVar154[5] = 0;
  bVar157 = auVar117[0xb];
  auVar154[6] = bVar157;
  auVar154[7] = 0;
  bVar158 = auVar117[0xc];
  auVar154[8] = bVar158;
  auVar154[9] = 0;
  bVar159 = auVar117[0xd];
  auVar154[10] = bVar159;
  auVar154[0xb] = 0;
  bVar160 = auVar117[0xe];
  auVar154[0xc] = bVar160;
  auVar154[0xd] = 0;
  bVar161 = auVar117[0xf];
  auVar154[0xe] = bVar161;
  auVar154[0xf] = 0;
  auVar60[0xd] = 0;
  auVar60._0_13_ = auVar122._0_13_;
  auVar60[0xe] = auVar122[7];
  uVar65 = auVar60._13_2_;
  auVar66[0xc] = auVar122[6];
  auVar66._0_12_ = auVar122._0_12_;
  auVar66._13_2_ = uVar65;
  auVar72[0xb] = 0;
  auVar72._0_11_ = auVar122._0_11_;
  auVar72._12_3_ = auVar66._12_3_;
  auVar76[10] = auVar122[5];
  auVar76._0_10_ = auVar122._0_10_;
  auVar76._11_4_ = auVar72._11_4_;
  auVar80[9] = 0;
  auVar80._0_9_ = auVar122._0_9_;
  auVar80._10_5_ = auVar76._10_5_;
  auVar84[8] = auVar122[4];
  auVar84._0_8_ = auVar122._0_8_;
  auVar84._9_6_ = auVar80._9_6_;
  auVar94._7_8_ = 0;
  auVar94._0_7_ = auVar84._8_7_;
  Var95 = CONCAT81(SUB158(auVar94 << 0x40,7),auVar122[3]);
  auVar105._9_6_ = 0;
  auVar105._0_9_ = Var95;
  auVar96._1_10_ = SUB1510(auVar105 << 0x30,5);
  auVar96[0] = auVar122[2];
  auVar106._11_4_ = 0;
  auVar106._0_11_ = auVar96;
  auVar88[2] = auVar122[1];
  auVar88._0_2_ = auVar122._0_2_;
  auVar88._3_12_ = SUB1512(auVar106 << 0x20,3);
  auVar194._0_2_ = auVar122._0_2_ & 0xff;
  auVar194._2_13_ = auVar88._2_13_;
  auVar194[0xf] = 0;
  auVar121._0_2_ = CONCAT11(0,auVar122[8]);
  bVar133 = auVar122[9];
  auVar121[2] = bVar133;
  auVar121[3] = 0;
  bVar134 = auVar122[10];
  auVar121[4] = bVar134;
  auVar121[5] = 0;
  bVar136 = auVar122[0xb];
  auVar121[6] = bVar136;
  auVar121[7] = 0;
  bVar137 = auVar122[0xc];
  auVar121[8] = bVar137;
  auVar121[9] = 0;
  bVar139 = auVar122[0xd];
  auVar121[10] = bVar139;
  auVar121[0xb] = 0;
  bVar140 = auVar122[0xe];
  auVar121[0xc] = bVar140;
  auVar121[0xd] = 0;
  bVar142 = auVar122[0xf];
  auVar121[0xe] = bVar142;
  auVar121[0xf] = 0;
  auVar61[0xd] = 0;
  auVar61._0_13_ = auVar123._0_13_;
  auVar61[0xe] = auVar123[7];
  uVar67 = auVar61._13_2_;
  auVar68[0xc] = auVar123[6];
  auVar68._0_12_ = auVar123._0_12_;
  auVar68._13_2_ = uVar67;
  auVar73[0xb] = 0;
  auVar73._0_11_ = auVar123._0_11_;
  auVar73._12_3_ = auVar68._12_3_;
  auVar77[10] = auVar123[5];
  auVar77._0_10_ = auVar123._0_10_;
  auVar77._11_4_ = auVar73._11_4_;
  auVar81[9] = 0;
  auVar81._0_9_ = auVar123._0_9_;
  auVar81._10_5_ = auVar77._10_5_;
  auVar85[8] = auVar123[4];
  auVar85._0_8_ = auVar123._0_8_;
  auVar85._9_6_ = auVar81._9_6_;
  auVar97._7_8_ = 0;
  auVar97._0_7_ = auVar85._8_7_;
  Var98 = CONCAT81(SUB158(auVar97 << 0x40,7),auVar123[3]);
  auVar107._9_6_ = 0;
  auVar107._0_9_ = Var98;
  auVar99._1_10_ = SUB1510(auVar107 << 0x30,5);
  auVar99[0] = auVar123[2];
  auVar108._11_4_ = 0;
  auVar108._0_11_ = auVar99;
  auVar89[2] = auVar123[1];
  auVar89._0_2_ = auVar123._0_2_;
  auVar89._3_12_ = SUB1512(auVar108 << 0x20,3);
  auVar170._0_2_ = auVar123._0_2_ & 0xff;
  auVar170._2_13_ = auVar89._2_13_;
  auVar170[0xf] = 0;
  auVar162._0_2_ = CONCAT11(0,auVar123[8]);
  bVar163 = auVar123[9];
  auVar162[2] = bVar163;
  auVar162[3] = 0;
  bVar164 = auVar123[10];
  auVar162[4] = bVar164;
  auVar162[5] = 0;
  bVar165 = auVar123[0xb];
  auVar162[6] = bVar165;
  auVar162[7] = 0;
  bVar166 = auVar123[0xc];
  auVar162[8] = bVar166;
  auVar162[9] = 0;
  bVar167 = auVar123[0xd];
  auVar162[10] = bVar167;
  auVar162[0xb] = 0;
  bVar168 = auVar123[0xe];
  auVar162[0xc] = bVar168;
  auVar162[0xd] = 0;
  bVar169 = auVar123[0xf];
  auVar162[0xe] = bVar169;
  auVar162[0xf] = 0;
  auVar62[0xd] = 0;
  auVar62._0_13_ = auVar124._0_13_;
  auVar62[0xe] = auVar124[7];
  uVar69 = auVar62._13_2_;
  auVar70[0xc] = auVar124[6];
  auVar70._0_12_ = auVar124._0_12_;
  auVar70._13_2_ = uVar69;
  auVar74[0xb] = 0;
  auVar74._0_11_ = auVar124._0_11_;
  auVar74._12_3_ = auVar70._12_3_;
  auVar78[10] = auVar124[5];
  auVar78._0_10_ = auVar124._0_10_;
  auVar78._11_4_ = auVar74._11_4_;
  auVar82[9] = 0;
  auVar82._0_9_ = auVar124._0_9_;
  auVar82._10_5_ = auVar78._10_5_;
  auVar86[8] = auVar124[4];
  auVar86._0_8_ = auVar124._0_8_;
  auVar86._9_6_ = auVar82._9_6_;
  auVar100._7_8_ = 0;
  auVar100._0_7_ = auVar86._8_7_;
  Var101 = CONCAT81(SUB158(auVar100 << 0x40,7),auVar124[3]);
  auVar109._9_6_ = 0;
  auVar109._0_9_ = Var101;
  auVar102._1_10_ = SUB1510(auVar109 << 0x30,5);
  auVar102[0] = auVar124[2];
  auVar110._11_4_ = 0;
  auVar110._0_11_ = auVar102;
  auVar90[2] = auVar124[1];
  auVar90._0_2_ = auVar124._0_2_;
  auVar90._3_12_ = SUB1512(auVar110 << 0x20,3);
  auVar182._0_2_ = auVar124._0_2_ & 0xff;
  auVar182._2_13_ = auVar90._2_13_;
  auVar182[0xf] = 0;
  auVar146._0_2_ = CONCAT11(0,auVar124[8]);
  bVar147 = auVar124[9];
  auVar146[2] = bVar147;
  auVar146[3] = 0;
  bVar148 = auVar124[10];
  auVar146[4] = bVar148;
  auVar146[5] = 0;
  bVar149 = auVar124[0xb];
  auVar146[6] = bVar149;
  auVar146[7] = 0;
  bVar150 = auVar124[0xc];
  auVar146[8] = bVar150;
  auVar146[9] = 0;
  bVar151 = auVar124[0xd];
  auVar146[10] = bVar151;
  auVar146[0xb] = 0;
  bVar152 = auVar124[0xe];
  auVar146[0xc] = bVar152;
  auVar146[0xd] = 0;
  bVar153 = auVar124[0xf];
  auVar146[0xe] = bVar153;
  auVar146[0xf] = 0;
  auVar117 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  uVar116 = auVar117._0_4_;
  sVar180 = auVar117._0_2_;
  sVar181 = auVar117._2_2_;
  auVar117._0_2_ = auVar143._0_2_ - sVar180;
  auVar117._2_2_ = auVar87._2_2_ - sVar181;
  auVar117._4_2_ = auVar93._0_2_ - sVar180;
  sVar119 = (short)Var92;
  auVar117._6_2_ = sVar119 - sVar181;
  auVar117._8_2_ = auVar83._8_2_ - sVar180;
  auVar117._10_2_ = auVar75._10_2_ - sVar181;
  auVar117._12_2_ = auVar64._12_2_ - sVar180;
  auVar117._14_2_ = (uVar63 >> 8) - sVar181;
  auVar198._0_2_ = auVar154._0_2_ - sVar180;
  auVar198._2_2_ = (ushort)bVar155 - sVar181;
  auVar198._4_2_ = (ushort)bVar156 - sVar180;
  auVar198._6_2_ = (ushort)bVar157 - sVar181;
  auVar198._8_2_ = (ushort)bVar158 - sVar180;
  auVar198._10_2_ = (ushort)bVar159 - sVar181;
  auVar198._12_2_ = (ushort)bVar160 - sVar180;
  auVar198._14_2_ = (ushort)bVar161 - sVar181;
  auVar215._0_2_ = auVar194._0_2_ - sVar180;
  auVar215._2_2_ = auVar88._2_2_ - sVar181;
  auVar215._4_2_ = auVar96._0_2_ - sVar180;
  sVar222 = (short)Var95;
  auVar215._6_2_ = sVar222 - sVar181;
  auVar215._8_2_ = auVar84._8_2_ - sVar180;
  auVar215._10_2_ = auVar76._10_2_ - sVar181;
  auVar215._12_2_ = auVar66._12_2_ - sVar180;
  auVar215._14_2_ = (uVar65 >> 8) - sVar181;
  auVar122._0_2_ = auVar121._0_2_ - sVar180;
  auVar122._2_2_ = (ushort)bVar133 - sVar181;
  auVar122._4_2_ = (ushort)bVar134 - sVar180;
  auVar122._6_2_ = (ushort)bVar136 - sVar181;
  auVar122._8_2_ = (ushort)bVar137 - sVar180;
  auVar122._10_2_ = (ushort)bVar139 - sVar181;
  auVar122._12_2_ = (ushort)bVar140 - sVar180;
  auVar122._14_2_ = (ushort)bVar142 - sVar181;
  auVar171._0_2_ = auVar170._0_2_ - sVar180;
  auVar171._2_2_ = auVar89._2_2_ - sVar181;
  auVar171._4_2_ = auVar99._0_2_ - sVar180;
  sVar179 = (short)Var98;
  auVar171._6_2_ = sVar179 - sVar181;
  auVar171._8_2_ = auVar85._8_2_ - sVar180;
  auVar171._10_2_ = auVar77._10_2_ - sVar181;
  auVar171._12_2_ = auVar68._12_2_ - sVar180;
  auVar171._14_2_ = (uVar67 >> 8) - sVar181;
  auVar144._0_2_ = auVar162._0_2_ - sVar180;
  auVar144._2_2_ = (ushort)bVar163 - sVar181;
  auVar144._4_2_ = (ushort)bVar164 - sVar180;
  auVar144._6_2_ = (ushort)bVar165 - sVar181;
  auVar144._8_2_ = (ushort)bVar166 - sVar180;
  auVar144._10_2_ = (ushort)bVar167 - sVar181;
  auVar144._12_2_ = (ushort)bVar168 - sVar180;
  auVar144._14_2_ = (ushort)bVar169 - sVar181;
  auVar183._0_2_ = auVar182._0_2_ - sVar180;
  auVar183._2_2_ = auVar90._2_2_ - sVar181;
  auVar183._4_2_ = auVar102._0_2_ - sVar180;
  sVar193 = (short)Var101;
  auVar183._6_2_ = sVar193 - sVar181;
  auVar183._8_2_ = auVar86._8_2_ - sVar180;
  auVar183._10_2_ = auVar78._10_2_ - sVar181;
  auVar183._12_2_ = auVar70._12_2_ - sVar180;
  auVar183._14_2_ = (uVar69 >> 8) - sVar181;
  auVar195._0_2_ = auVar146._0_2_ - sVar180;
  auVar195._2_2_ = (ushort)bVar147 - sVar181;
  auVar195._4_2_ = (ushort)bVar148 - sVar180;
  auVar195._6_2_ = (ushort)bVar149 - sVar181;
  auVar195._8_2_ = (ushort)bVar150 - sVar180;
  auVar195._10_2_ = (ushort)bVar151 - sVar181;
  auVar195._12_2_ = (ushort)bVar152 - sVar180;
  auVar195._14_2_ = (ushort)bVar153 - sVar181;
  lVar115 = 0;
  auVar223 = pabsw(in_XMM14,auVar117);
  auVar208 = pabsw(in_XMM12,auVar198);
  auVar209 = pabsw(auVar208,auVar215);
  auVar123 = pabsw(auVar122,auVar122);
  auVar124 = pabsw(auVar123,auVar171);
  auVar125 = pabsw(auVar124,auVar144);
  auVar126 = pabsw(auVar125,auVar183);
  auVar127 = pabsw(auVar126,auVar195);
  bVar112 = true;
  do {
    bVar113 = bVar112;
    auVar111 = *(undefined1 (*) [16])(left + lVar115);
    iVar114 = 0x10;
    auVar145 = _DAT_004d8ba0;
    do {
      auVar128 = pshufb(auVar111,auVar145);
      sVar120 = auVar128._0_2_;
      sVar129 = auVar128._2_2_;
      sVar130 = auVar128._4_2_;
      sVar131 = auVar128._6_2_;
      sVar132 = auVar128._8_2_;
      sVar135 = auVar128._10_2_;
      sVar138 = auVar128._12_2_;
      sVar141 = auVar128._14_2_;
      auVar184._0_2_ = (auVar117._0_2_ + sVar120) - auVar143._0_2_;
      auVar184._2_2_ = (auVar117._2_2_ + sVar129) - auVar87._2_2_;
      auVar184._4_2_ = (auVar117._4_2_ + sVar130) - auVar93._0_2_;
      auVar184._6_2_ = (auVar117._6_2_ + sVar131) - sVar119;
      auVar184._8_2_ = (auVar117._8_2_ + sVar132) - auVar83._8_2_;
      auVar184._10_2_ = (auVar117._10_2_ + sVar135) - auVar75._10_2_;
      auVar184._12_2_ = (auVar117._12_2_ + sVar138) - auVar64._12_2_;
      auVar184._14_2_ = (auVar117._14_2_ + sVar141) - (uVar63 >> 8);
      auVar185 = pabsw(auVar184,auVar184);
      auVar197._0_2_ = (auVar117._0_2_ + sVar120) - sVar180;
      auVar197._2_2_ = (auVar117._2_2_ + sVar129) - sVar181;
      auVar197._4_2_ = (auVar117._4_2_ + sVar130) - sVar180;
      auVar197._6_2_ = (auVar117._6_2_ + sVar131) - sVar181;
      auVar197._8_2_ = (auVar117._8_2_ + sVar132) - sVar180;
      auVar197._10_2_ = (auVar117._10_2_ + sVar135) - sVar181;
      auVar197._12_2_ = (auVar117._12_2_ + sVar138) - sVar180;
      auVar197._14_2_ = (auVar117._14_2_ + sVar141) - sVar181;
      auVar172 = pabsw(auVar197,auVar197);
      auVar210._0_2_ = -(ushort)(auVar185._0_2_ < auVar223._0_2_);
      auVar210._2_2_ = -(ushort)(auVar185._2_2_ < auVar223._2_2_);
      auVar210._4_2_ = -(ushort)(auVar185._4_2_ < auVar223._4_2_);
      auVar210._6_2_ = -(ushort)(auVar185._6_2_ < auVar223._6_2_);
      auVar210._8_2_ = -(ushort)(auVar185._8_2_ < auVar223._8_2_);
      auVar210._10_2_ = -(ushort)(auVar185._10_2_ < auVar223._10_2_);
      auVar210._12_2_ = -(ushort)(auVar185._12_2_ < auVar223._12_2_);
      auVar210._14_2_ = -(ushort)(auVar185._14_2_ < auVar223._14_2_);
      auVar196._0_2_ = -(ushort)(auVar172._0_2_ < auVar223._0_2_);
      auVar196._2_2_ = -(ushort)(auVar172._2_2_ < auVar223._2_2_);
      auVar196._4_2_ = -(ushort)(auVar172._4_2_ < auVar223._4_2_);
      auVar196._6_2_ = -(ushort)(auVar172._6_2_ < auVar223._6_2_);
      auVar196._8_2_ = -(ushort)(auVar172._8_2_ < auVar223._8_2_);
      auVar196._10_2_ = -(ushort)(auVar172._10_2_ < auVar223._10_2_);
      auVar196._12_2_ = -(ushort)(auVar172._12_2_ < auVar223._12_2_);
      auVar196._14_2_ = -(ushort)(auVar172._14_2_ < auVar223._14_2_);
      auVar186._0_2_ = -(ushort)(auVar172._0_2_ < auVar185._0_2_);
      auVar186._2_2_ = -(ushort)(auVar172._2_2_ < auVar185._2_2_);
      auVar186._4_2_ = -(ushort)(auVar172._4_2_ < auVar185._4_2_);
      auVar186._6_2_ = -(ushort)(auVar172._6_2_ < auVar185._6_2_);
      auVar186._8_2_ = -(ushort)(auVar172._8_2_ < auVar185._8_2_);
      auVar186._10_2_ = -(ushort)(auVar172._10_2_ < auVar185._10_2_);
      auVar186._12_2_ = -(ushort)(auVar172._12_2_ < auVar185._12_2_);
      auVar186._14_2_ = -(ushort)(auVar172._14_2_ < auVar185._14_2_);
      auVar172._4_2_ = sVar180;
      auVar172._0_4_ = uVar116;
      auVar172._6_2_ = sVar181;
      auVar172._8_2_ = sVar180;
      auVar172._10_2_ = sVar181;
      auVar172._12_2_ = sVar180;
      auVar172._14_2_ = sVar181;
      auVar211._0_2_ = (auVar198._0_2_ + sVar120) - auVar154._0_2_;
      auVar211._2_2_ = (auVar198._2_2_ + sVar129) - (ushort)bVar155;
      auVar211._4_2_ = (auVar198._4_2_ + sVar130) - (ushort)bVar156;
      auVar211._6_2_ = (auVar198._6_2_ + sVar131) - (ushort)bVar157;
      auVar211._8_2_ = (auVar198._8_2_ + sVar132) - (ushort)bVar158;
      auVar211._10_2_ = (auVar198._10_2_ + sVar135) - (ushort)bVar159;
      auVar211._12_2_ = (auVar198._12_2_ + sVar138) - (ushort)bVar160;
      auVar211._14_2_ = (auVar198._14_2_ + sVar141) - (ushort)bVar161;
      auVar212 = pabsw(auVar211,auVar211);
      auVar200._0_2_ = (auVar198._0_2_ + sVar120) - sVar180;
      auVar200._2_2_ = (auVar198._2_2_ + sVar129) - sVar181;
      auVar200._4_2_ = (auVar198._4_2_ + sVar130) - sVar180;
      auVar200._6_2_ = (auVar198._6_2_ + sVar131) - sVar181;
      auVar200._8_2_ = (auVar198._8_2_ + sVar132) - sVar180;
      auVar200._10_2_ = (auVar198._10_2_ + sVar135) - sVar181;
      auVar200._12_2_ = (auVar198._12_2_ + sVar138) - sVar180;
      auVar200._14_2_ = (auVar198._14_2_ + sVar141) - sVar181;
      auVar185 = pabsw(auVar200,auVar200);
      local_f8 = auVar208._0_2_;
      sStack_f6 = auVar208._2_2_;
      sStack_f4 = auVar208._4_2_;
      sStack_f2 = auVar208._6_2_;
      sStack_f0 = auVar208._8_2_;
      sStack_ee = auVar208._10_2_;
      sStack_ec = auVar208._12_2_;
      sStack_ea = auVar208._14_2_;
      auVar224._0_2_ = -(ushort)(auVar212._0_2_ < local_f8);
      auVar224._2_2_ = -(ushort)(auVar212._2_2_ < sStack_f6);
      auVar224._4_2_ = -(ushort)(auVar212._4_2_ < sStack_f4);
      auVar224._6_2_ = -(ushort)(auVar212._6_2_ < sStack_f2);
      auVar224._8_2_ = -(ushort)(auVar212._8_2_ < sStack_f0);
      auVar224._10_2_ = -(ushort)(auVar212._10_2_ < sStack_ee);
      auVar224._12_2_ = -(ushort)(auVar212._12_2_ < sStack_ec);
      auVar224._14_2_ = -(ushort)(auVar212._14_2_ < sStack_ea);
      auVar199._0_2_ = -(ushort)(auVar185._0_2_ < local_f8);
      auVar199._2_2_ = -(ushort)(auVar185._2_2_ < sStack_f6);
      auVar199._4_2_ = -(ushort)(auVar185._4_2_ < sStack_f4);
      auVar199._6_2_ = -(ushort)(auVar185._6_2_ < sStack_f2);
      auVar199._8_2_ = -(ushort)(auVar185._8_2_ < sStack_f0);
      auVar199._10_2_ = -(ushort)(auVar185._10_2_ < sStack_ee);
      auVar199._12_2_ = -(ushort)(auVar185._12_2_ < sStack_ec);
      auVar199._14_2_ = -(ushort)(auVar185._14_2_ < sStack_ea);
      auVar213._0_2_ = -(ushort)(auVar185._0_2_ < auVar212._0_2_);
      auVar213._2_2_ = -(ushort)(auVar185._2_2_ < auVar212._2_2_);
      auVar213._4_2_ = -(ushort)(auVar185._4_2_ < auVar212._4_2_);
      auVar213._6_2_ = -(ushort)(auVar185._6_2_ < auVar212._6_2_);
      auVar213._8_2_ = -(ushort)(auVar185._8_2_ < auVar212._8_2_);
      auVar213._10_2_ = -(ushort)(auVar185._10_2_ < auVar212._10_2_);
      auVar213._12_2_ = -(ushort)(auVar185._12_2_ < auVar212._12_2_);
      auVar213._14_2_ = -(ushort)(auVar185._14_2_ < auVar212._14_2_);
      auVar185._4_2_ = sVar180;
      auVar185._0_4_ = uVar116;
      auVar185._6_2_ = sVar181;
      auVar185._8_2_ = sVar180;
      auVar185._10_2_ = sVar181;
      auVar185._12_2_ = sVar180;
      auVar185._14_2_ = sVar181;
      auVar197 = ~(auVar196 | auVar210) & auVar128 |
                 (~auVar186 & auVar143 | auVar172 & auVar186) & (auVar196 | auVar210);
      auVar200 = ~(auVar199 | auVar224) & auVar128 |
                 (~auVar213 & auVar154 | auVar185 & auVar213) & (auVar199 | auVar224);
      sVar1 = auVar197._0_2_;
      sVar4 = auVar197._2_2_;
      sVar7 = auVar197._4_2_;
      sVar10 = auVar197._6_2_;
      sVar13 = auVar197._8_2_;
      sVar16 = auVar197._10_2_;
      sVar19 = auVar197._12_2_;
      sVar22 = auVar197._14_2_;
      sVar25 = auVar200._0_2_;
      sVar29 = auVar200._2_2_;
      sVar33 = auVar200._4_2_;
      sVar37 = auVar200._6_2_;
      sVar41 = auVar200._8_2_;
      sVar45 = auVar200._10_2_;
      sVar49 = auVar200._12_2_;
      sVar53 = auVar200._14_2_;
      auVar187._0_2_ = (auVar215._0_2_ + sVar120) - auVar194._0_2_;
      auVar187._2_2_ = (auVar215._2_2_ + sVar129) - auVar88._2_2_;
      auVar187._4_2_ = (auVar215._4_2_ + sVar130) - auVar96._0_2_;
      auVar187._6_2_ = (auVar215._6_2_ + sVar131) - sVar222;
      auVar187._8_2_ = (auVar215._8_2_ + sVar132) - auVar84._8_2_;
      auVar187._10_2_ = (auVar215._10_2_ + sVar135) - auVar76._10_2_;
      auVar187._12_2_ = (auVar215._12_2_ + sVar138) - auVar66._12_2_;
      auVar187._14_2_ = (auVar215._14_2_ + sVar141) - (uVar65 >> 8);
      auVar185 = pabsw(auVar187,auVar187);
      auVar173._0_2_ = (auVar215._0_2_ + sVar120) - sVar180;
      auVar173._2_2_ = (auVar215._2_2_ + sVar129) - sVar181;
      auVar173._4_2_ = (auVar215._4_2_ + sVar130) - sVar180;
      auVar173._6_2_ = (auVar215._6_2_ + sVar131) - sVar181;
      auVar173._8_2_ = (auVar215._8_2_ + sVar132) - sVar180;
      auVar173._10_2_ = (auVar215._10_2_ + sVar135) - sVar181;
      auVar173._12_2_ = (auVar215._12_2_ + sVar138) - sVar180;
      auVar173._14_2_ = (auVar215._14_2_ + sVar141) - sVar181;
      auVar172 = pabsw(auVar173,auVar173);
      local_108 = auVar209._0_2_;
      sStack_106 = auVar209._2_2_;
      sStack_104 = auVar209._4_2_;
      sStack_102 = auVar209._6_2_;
      sStack_100 = auVar209._8_2_;
      sStack_fe = auVar209._10_2_;
      sStack_fc = auVar209._12_2_;
      sStack_fa = auVar209._14_2_;
      auVar201._0_2_ = -(ushort)(auVar185._0_2_ < local_108);
      auVar201._2_2_ = -(ushort)(auVar185._2_2_ < sStack_106);
      auVar201._4_2_ = -(ushort)(auVar185._4_2_ < sStack_104);
      auVar201._6_2_ = -(ushort)(auVar185._6_2_ < sStack_102);
      auVar201._8_2_ = -(ushort)(auVar185._8_2_ < sStack_100);
      auVar201._10_2_ = -(ushort)(auVar185._10_2_ < sStack_fe);
      auVar201._12_2_ = -(ushort)(auVar185._12_2_ < sStack_fc);
      auVar201._14_2_ = -(ushort)(auVar185._14_2_ < sStack_fa);
      auVar214._0_2_ = -(ushort)(auVar172._0_2_ < local_108);
      auVar214._2_2_ = -(ushort)(auVar172._2_2_ < sStack_106);
      auVar214._4_2_ = -(ushort)(auVar172._4_2_ < sStack_104);
      auVar214._6_2_ = -(ushort)(auVar172._6_2_ < sStack_102);
      auVar214._8_2_ = -(ushort)(auVar172._8_2_ < sStack_100);
      auVar214._10_2_ = -(ushort)(auVar172._10_2_ < sStack_fe);
      auVar214._12_2_ = -(ushort)(auVar172._12_2_ < sStack_fc);
      auVar214._14_2_ = -(ushort)(auVar172._14_2_ < sStack_fa);
      auVar188._0_2_ = -(ushort)(auVar172._0_2_ < auVar185._0_2_);
      auVar188._2_2_ = -(ushort)(auVar172._2_2_ < auVar185._2_2_);
      auVar188._4_2_ = -(ushort)(auVar172._4_2_ < auVar185._4_2_);
      auVar188._6_2_ = -(ushort)(auVar172._6_2_ < auVar185._6_2_);
      auVar188._8_2_ = -(ushort)(auVar172._8_2_ < auVar185._8_2_);
      auVar188._10_2_ = -(ushort)(auVar172._10_2_ < auVar185._10_2_);
      auVar188._12_2_ = -(ushort)(auVar172._12_2_ < auVar185._12_2_);
      auVar188._14_2_ = -(ushort)(auVar172._14_2_ < auVar185._14_2_);
      auVar212._4_2_ = sVar180;
      auVar212._0_4_ = uVar116;
      auVar212._6_2_ = sVar181;
      auVar212._8_2_ = sVar180;
      auVar212._10_2_ = sVar181;
      auVar212._12_2_ = sVar180;
      auVar212._14_2_ = sVar181;
      auVar202._0_2_ = (auVar122._0_2_ + sVar120) - auVar121._0_2_;
      auVar202._2_2_ = (auVar122._2_2_ + sVar129) - (ushort)bVar133;
      auVar202._4_2_ = (auVar122._4_2_ + sVar130) - (ushort)bVar134;
      auVar202._6_2_ = (auVar122._6_2_ + sVar131) - (ushort)bVar136;
      auVar202._8_2_ = (auVar122._8_2_ + sVar132) - (ushort)bVar137;
      auVar202._10_2_ = (auVar122._10_2_ + sVar135) - (ushort)bVar139;
      auVar202._12_2_ = (auVar122._12_2_ + sVar138) - (ushort)bVar140;
      auVar202._14_2_ = (auVar122._14_2_ + sVar141) - (ushort)bVar142;
      auVar185 = pabsw(auVar202,auVar202);
      auVar174._0_2_ = (auVar122._0_2_ + sVar120) - sVar180;
      auVar174._2_2_ = (auVar122._2_2_ + sVar129) - sVar181;
      auVar174._4_2_ = (auVar122._4_2_ + sVar130) - sVar180;
      auVar174._6_2_ = (auVar122._6_2_ + sVar131) - sVar181;
      auVar174._8_2_ = (auVar122._8_2_ + sVar132) - sVar180;
      auVar174._10_2_ = (auVar122._10_2_ + sVar135) - sVar181;
      auVar174._12_2_ = (auVar122._12_2_ + sVar138) - sVar180;
      auVar174._14_2_ = (auVar122._14_2_ + sVar141) - sVar181;
      auVar172 = pabsw(auVar174,auVar174);
      local_118 = auVar123._0_2_;
      sStack_116 = auVar123._2_2_;
      sStack_114 = auVar123._4_2_;
      sStack_112 = auVar123._6_2_;
      sStack_110 = auVar123._8_2_;
      sStack_10e = auVar123._10_2_;
      sStack_10c = auVar123._12_2_;
      sStack_10a = auVar123._14_2_;
      auVar225._0_2_ = -(ushort)(auVar185._0_2_ < local_118);
      auVar225._2_2_ = -(ushort)(auVar185._2_2_ < sStack_116);
      auVar225._4_2_ = -(ushort)(auVar185._4_2_ < sStack_114);
      auVar225._6_2_ = -(ushort)(auVar185._6_2_ < sStack_112);
      auVar225._8_2_ = -(ushort)(auVar185._8_2_ < sStack_110);
      auVar225._10_2_ = -(ushort)(auVar185._10_2_ < sStack_10e);
      auVar225._12_2_ = -(ushort)(auVar185._12_2_ < sStack_10c);
      auVar225._14_2_ = -(ushort)(auVar185._14_2_ < sStack_10a);
      auVar216._0_2_ = -(ushort)(auVar172._0_2_ < local_118);
      auVar216._2_2_ = -(ushort)(auVar172._2_2_ < sStack_116);
      auVar216._4_2_ = -(ushort)(auVar172._4_2_ < sStack_114);
      auVar216._6_2_ = -(ushort)(auVar172._6_2_ < sStack_112);
      auVar216._8_2_ = -(ushort)(auVar172._8_2_ < sStack_110);
      auVar216._10_2_ = -(ushort)(auVar172._10_2_ < sStack_10e);
      auVar216._12_2_ = -(ushort)(auVar172._12_2_ < sStack_10c);
      auVar216._14_2_ = -(ushort)(auVar172._14_2_ < sStack_10a);
      auVar203._0_2_ = -(ushort)(auVar172._0_2_ < auVar185._0_2_);
      auVar203._2_2_ = -(ushort)(auVar172._2_2_ < auVar185._2_2_);
      auVar203._4_2_ = -(ushort)(auVar172._4_2_ < auVar185._4_2_);
      auVar203._6_2_ = -(ushort)(auVar172._6_2_ < auVar185._6_2_);
      auVar203._8_2_ = -(ushort)(auVar172._8_2_ < auVar185._8_2_);
      auVar203._10_2_ = -(ushort)(auVar172._10_2_ < auVar185._10_2_);
      auVar203._12_2_ = -(ushort)(auVar172._12_2_ < auVar185._12_2_);
      auVar203._14_2_ = -(ushort)(auVar172._14_2_ < auVar185._14_2_);
      auVar217._4_2_ = sVar180;
      auVar217._0_4_ = uVar116;
      auVar217._6_2_ = sVar181;
      auVar217._8_2_ = sVar180;
      auVar217._10_2_ = sVar181;
      auVar217._12_2_ = sVar180;
      auVar217._14_2_ = sVar181;
      auVar212 = ~(auVar214 | auVar201) & auVar128 |
                 (~auVar188 & auVar194 | auVar212 & auVar188) & (auVar214 | auVar201);
      auVar217 = ~(auVar216 | auVar225) & auVar128 |
                 (~auVar203 & auVar121 | auVar217 & auVar203) & (auVar216 | auVar225);
      sVar2 = auVar212._0_2_;
      sVar5 = auVar212._2_2_;
      sVar8 = auVar212._4_2_;
      sVar11 = auVar212._6_2_;
      sVar14 = auVar212._8_2_;
      sVar17 = auVar212._10_2_;
      sVar20 = auVar212._12_2_;
      sVar23 = auVar212._14_2_;
      sVar26 = auVar217._0_2_;
      sVar30 = auVar217._2_2_;
      sVar34 = auVar217._4_2_;
      sVar38 = auVar217._6_2_;
      sVar42 = auVar217._8_2_;
      sVar46 = auVar217._10_2_;
      sVar50 = auVar217._12_2_;
      sVar54 = auVar217._14_2_;
      auVar189._0_2_ = (auVar171._0_2_ + sVar120) - auVar170._0_2_;
      auVar189._2_2_ = (auVar171._2_2_ + sVar129) - auVar89._2_2_;
      auVar189._4_2_ = (auVar171._4_2_ + sVar130) - auVar99._0_2_;
      auVar189._6_2_ = (auVar171._6_2_ + sVar131) - sVar179;
      auVar189._8_2_ = (auVar171._8_2_ + sVar132) - auVar85._8_2_;
      auVar189._10_2_ = (auVar171._10_2_ + sVar135) - auVar77._10_2_;
      auVar189._12_2_ = (auVar171._12_2_ + sVar138) - auVar68._12_2_;
      auVar189._14_2_ = (auVar171._14_2_ + sVar141) - (uVar67 >> 8);
      auVar185 = pabsw(auVar189,auVar189);
      auVar175._0_2_ = (auVar171._0_2_ + sVar120) - sVar180;
      auVar175._2_2_ = (auVar171._2_2_ + sVar129) - sVar181;
      auVar175._4_2_ = (auVar171._4_2_ + sVar130) - sVar180;
      auVar175._6_2_ = (auVar171._6_2_ + sVar131) - sVar181;
      auVar175._8_2_ = (auVar171._8_2_ + sVar132) - sVar180;
      auVar175._10_2_ = (auVar171._10_2_ + sVar135) - sVar181;
      auVar175._12_2_ = (auVar171._12_2_ + sVar138) - sVar180;
      auVar175._14_2_ = (auVar171._14_2_ + sVar141) - sVar181;
      auVar172 = pabsw(auVar175,auVar175);
      local_128 = auVar124._0_2_;
      sStack_126 = auVar124._2_2_;
      sStack_124 = auVar124._4_2_;
      sStack_122 = auVar124._6_2_;
      sStack_120 = auVar124._8_2_;
      sStack_11e = auVar124._10_2_;
      sStack_11c = auVar124._12_2_;
      sStack_11a = auVar124._14_2_;
      auVar204._0_2_ = -(ushort)(auVar185._0_2_ < local_128);
      auVar204._2_2_ = -(ushort)(auVar185._2_2_ < sStack_126);
      auVar204._4_2_ = -(ushort)(auVar185._4_2_ < sStack_124);
      auVar204._6_2_ = -(ushort)(auVar185._6_2_ < sStack_122);
      auVar204._8_2_ = -(ushort)(auVar185._8_2_ < sStack_120);
      auVar204._10_2_ = -(ushort)(auVar185._10_2_ < sStack_11e);
      auVar204._12_2_ = -(ushort)(auVar185._12_2_ < sStack_11c);
      auVar204._14_2_ = -(ushort)(auVar185._14_2_ < sStack_11a);
      auVar226._0_2_ = -(ushort)(auVar172._0_2_ < local_128);
      auVar226._2_2_ = -(ushort)(auVar172._2_2_ < sStack_126);
      auVar226._4_2_ = -(ushort)(auVar172._4_2_ < sStack_124);
      auVar226._6_2_ = -(ushort)(auVar172._6_2_ < sStack_122);
      auVar226._8_2_ = -(ushort)(auVar172._8_2_ < sStack_120);
      auVar226._10_2_ = -(ushort)(auVar172._10_2_ < sStack_11e);
      auVar226._12_2_ = -(ushort)(auVar172._12_2_ < sStack_11c);
      auVar226._14_2_ = -(ushort)(auVar172._14_2_ < sStack_11a);
      auVar190._0_2_ = -(ushort)(auVar172._0_2_ < auVar185._0_2_);
      auVar190._2_2_ = -(ushort)(auVar172._2_2_ < auVar185._2_2_);
      auVar190._4_2_ = -(ushort)(auVar172._4_2_ < auVar185._4_2_);
      auVar190._6_2_ = -(ushort)(auVar172._6_2_ < auVar185._6_2_);
      auVar190._8_2_ = -(ushort)(auVar172._8_2_ < auVar185._8_2_);
      auVar190._10_2_ = -(ushort)(auVar172._10_2_ < auVar185._10_2_);
      auVar190._12_2_ = -(ushort)(auVar172._12_2_ < auVar185._12_2_);
      auVar190._14_2_ = -(ushort)(auVar172._14_2_ < auVar185._14_2_);
      auVar227._4_2_ = sVar180;
      auVar227._0_4_ = uVar116;
      auVar227._6_2_ = sVar181;
      auVar227._8_2_ = sVar180;
      auVar227._10_2_ = sVar181;
      auVar227._12_2_ = sVar180;
      auVar227._14_2_ = sVar181;
      auVar205._0_2_ = (auVar144._0_2_ + sVar120) - auVar162._0_2_;
      auVar205._2_2_ = (auVar144._2_2_ + sVar129) - (ushort)bVar163;
      auVar205._4_2_ = (auVar144._4_2_ + sVar130) - (ushort)bVar164;
      auVar205._6_2_ = (auVar144._6_2_ + sVar131) - (ushort)bVar165;
      auVar205._8_2_ = (auVar144._8_2_ + sVar132) - (ushort)bVar166;
      auVar205._10_2_ = (auVar144._10_2_ + sVar135) - (ushort)bVar167;
      auVar205._12_2_ = (auVar144._12_2_ + sVar138) - (ushort)bVar168;
      auVar205._14_2_ = (auVar144._14_2_ + sVar141) - (ushort)bVar169;
      auVar185 = pabsw(auVar205,auVar205);
      auVar176._0_2_ = (auVar144._0_2_ + sVar120) - sVar180;
      auVar176._2_2_ = (auVar144._2_2_ + sVar129) - sVar181;
      auVar176._4_2_ = (auVar144._4_2_ + sVar130) - sVar180;
      auVar176._6_2_ = (auVar144._6_2_ + sVar131) - sVar181;
      auVar176._8_2_ = (auVar144._8_2_ + sVar132) - sVar180;
      auVar176._10_2_ = (auVar144._10_2_ + sVar135) - sVar181;
      auVar176._12_2_ = (auVar144._12_2_ + sVar138) - sVar180;
      auVar176._14_2_ = (auVar144._14_2_ + sVar141) - sVar181;
      auVar172 = pabsw(auVar176,auVar176);
      local_138 = auVar125._0_2_;
      sStack_136 = auVar125._2_2_;
      sStack_134 = auVar125._4_2_;
      sStack_132 = auVar125._6_2_;
      sStack_130 = auVar125._8_2_;
      sStack_12e = auVar125._10_2_;
      sStack_12c = auVar125._12_2_;
      sStack_12a = auVar125._14_2_;
      auVar218._0_2_ = -(ushort)(auVar185._0_2_ < local_138);
      auVar218._2_2_ = -(ushort)(auVar185._2_2_ < sStack_136);
      auVar218._4_2_ = -(ushort)(auVar185._4_2_ < sStack_134);
      auVar218._6_2_ = -(ushort)(auVar185._6_2_ < sStack_132);
      auVar218._8_2_ = -(ushort)(auVar185._8_2_ < sStack_130);
      auVar218._10_2_ = -(ushort)(auVar185._10_2_ < sStack_12e);
      auVar218._12_2_ = -(ushort)(auVar185._12_2_ < sStack_12c);
      auVar218._14_2_ = -(ushort)(auVar185._14_2_ < sStack_12a);
      auVar228._0_2_ = -(ushort)(auVar172._0_2_ < local_138);
      auVar228._2_2_ = -(ushort)(auVar172._2_2_ < sStack_136);
      auVar228._4_2_ = -(ushort)(auVar172._4_2_ < sStack_134);
      auVar228._6_2_ = -(ushort)(auVar172._6_2_ < sStack_132);
      auVar228._8_2_ = -(ushort)(auVar172._8_2_ < sStack_130);
      auVar228._10_2_ = -(ushort)(auVar172._10_2_ < sStack_12e);
      auVar228._12_2_ = -(ushort)(auVar172._12_2_ < sStack_12c);
      auVar228._14_2_ = -(ushort)(auVar172._14_2_ < sStack_12a);
      auVar206._0_2_ = -(ushort)(auVar172._0_2_ < auVar185._0_2_);
      auVar206._2_2_ = -(ushort)(auVar172._2_2_ < auVar185._2_2_);
      auVar206._4_2_ = -(ushort)(auVar172._4_2_ < auVar185._4_2_);
      auVar206._6_2_ = -(ushort)(auVar172._6_2_ < auVar185._6_2_);
      auVar206._8_2_ = -(ushort)(auVar172._8_2_ < auVar185._8_2_);
      auVar206._10_2_ = -(ushort)(auVar172._10_2_ < auVar185._10_2_);
      auVar206._12_2_ = -(ushort)(auVar172._12_2_ < auVar185._12_2_);
      auVar206._14_2_ = -(ushort)(auVar172._14_2_ < auVar185._14_2_);
      auVar229._4_2_ = sVar180;
      auVar229._0_4_ = uVar116;
      auVar229._6_2_ = sVar181;
      auVar229._8_2_ = sVar180;
      auVar229._10_2_ = sVar181;
      auVar229._12_2_ = sVar180;
      auVar229._14_2_ = sVar181;
      auVar227 = ~(auVar226 | auVar204) & auVar128 |
                 (~auVar190 & auVar170 | auVar227 & auVar190) & (auVar226 | auVar204);
      auVar185 = (~auVar206 & auVar162 | auVar229 & auVar206) & (auVar228 | auVar218);
      auVar229 = ~(auVar228 | auVar218) & auVar128 | auVar185;
      sVar3 = auVar227._0_2_;
      sVar6 = auVar227._2_2_;
      sVar9 = auVar227._4_2_;
      sVar12 = auVar227._6_2_;
      sVar15 = auVar227._8_2_;
      sVar18 = auVar227._10_2_;
      sVar21 = auVar227._12_2_;
      sVar24 = auVar227._14_2_;
      sVar27 = auVar229._0_2_;
      sVar31 = auVar229._2_2_;
      sVar35 = auVar229._4_2_;
      sVar39 = auVar229._6_2_;
      sVar43 = auVar229._8_2_;
      sVar47 = auVar229._10_2_;
      sVar51 = auVar229._12_2_;
      sVar55 = auVar229._14_2_;
      auVar177._0_2_ = (auVar183._0_2_ + sVar120) - auVar182._0_2_;
      auVar177._2_2_ = (auVar183._2_2_ + sVar129) - auVar90._2_2_;
      auVar177._4_2_ = (auVar183._4_2_ + sVar130) - auVar102._0_2_;
      auVar177._6_2_ = (auVar183._6_2_ + sVar131) - sVar193;
      auVar177._8_2_ = (auVar183._8_2_ + sVar132) - auVar86._8_2_;
      auVar177._10_2_ = (auVar183._10_2_ + sVar135) - auVar78._10_2_;
      auVar177._12_2_ = (auVar183._12_2_ + sVar138) - auVar70._12_2_;
      auVar177._14_2_ = (auVar183._14_2_ + sVar141) - (uVar69 >> 8);
      auVar172 = pabsw(auVar177,auVar177);
      auVar191._0_2_ = (auVar183._0_2_ + sVar120) - sVar180;
      auVar191._2_2_ = (auVar183._2_2_ + sVar129) - sVar181;
      auVar191._4_2_ = (auVar183._4_2_ + sVar130) - sVar180;
      auVar191._6_2_ = (auVar183._6_2_ + sVar131) - sVar181;
      auVar191._8_2_ = (auVar183._8_2_ + sVar132) - sVar180;
      auVar191._10_2_ = (auVar183._10_2_ + sVar135) - sVar181;
      auVar191._12_2_ = (auVar183._12_2_ + sVar138) - sVar180;
      auVar191._14_2_ = (auVar183._14_2_ + sVar141) - sVar181;
      auVar185 = pabsw(auVar185,auVar191);
      local_148 = auVar126._0_2_;
      sStack_146 = auVar126._2_2_;
      sStack_144 = auVar126._4_2_;
      sStack_142 = auVar126._6_2_;
      sStack_140 = auVar126._8_2_;
      sStack_13e = auVar126._10_2_;
      sStack_13c = auVar126._12_2_;
      sStack_13a = auVar126._14_2_;
      auVar219._0_2_ = -(ushort)(auVar172._0_2_ < local_148);
      auVar219._2_2_ = -(ushort)(auVar172._2_2_ < sStack_146);
      auVar219._4_2_ = -(ushort)(auVar172._4_2_ < sStack_144);
      auVar219._6_2_ = -(ushort)(auVar172._6_2_ < sStack_142);
      auVar219._8_2_ = -(ushort)(auVar172._8_2_ < sStack_140);
      auVar219._10_2_ = -(ushort)(auVar172._10_2_ < sStack_13e);
      auVar219._12_2_ = -(ushort)(auVar172._12_2_ < sStack_13c);
      auVar219._14_2_ = -(ushort)(auVar172._14_2_ < sStack_13a);
      auVar192._0_2_ = -(ushort)(auVar185._0_2_ < local_148);
      auVar192._2_2_ = -(ushort)(auVar185._2_2_ < sStack_146);
      auVar192._4_2_ = -(ushort)(auVar185._4_2_ < sStack_144);
      auVar192._6_2_ = -(ushort)(auVar185._6_2_ < sStack_142);
      auVar192._8_2_ = -(ushort)(auVar185._8_2_ < sStack_140);
      auVar192._10_2_ = -(ushort)(auVar185._10_2_ < sStack_13e);
      auVar192._12_2_ = -(ushort)(auVar185._12_2_ < sStack_13c);
      auVar192._14_2_ = -(ushort)(auVar185._14_2_ < sStack_13a);
      auVar178._0_2_ = -(ushort)(auVar185._0_2_ < auVar172._0_2_);
      auVar178._2_2_ = -(ushort)(auVar185._2_2_ < auVar172._2_2_);
      auVar178._4_2_ = -(ushort)(auVar185._4_2_ < auVar172._4_2_);
      auVar178._6_2_ = -(ushort)(auVar185._6_2_ < auVar172._6_2_);
      auVar178._8_2_ = -(ushort)(auVar185._8_2_ < auVar172._8_2_);
      auVar178._10_2_ = -(ushort)(auVar185._10_2_ < auVar172._10_2_);
      auVar178._12_2_ = -(ushort)(auVar185._12_2_ < auVar172._12_2_);
      auVar178._14_2_ = -(ushort)(auVar185._14_2_ < auVar172._14_2_);
      auVar57._4_2_ = sVar180;
      auVar57._0_4_ = uVar116;
      auVar57._6_2_ = sVar181;
      auVar57._8_2_ = sVar180;
      auVar57._10_2_ = sVar181;
      auVar57._12_2_ = sVar180;
      auVar57._14_2_ = sVar181;
      auVar220._0_2_ = (auVar195._0_2_ + sVar120) - auVar146._0_2_;
      auVar220._2_2_ = (auVar195._2_2_ + sVar129) - (ushort)bVar147;
      auVar220._4_2_ = (auVar195._4_2_ + sVar130) - (ushort)bVar148;
      auVar220._6_2_ = (auVar195._6_2_ + sVar131) - (ushort)bVar149;
      auVar220._8_2_ = (auVar195._8_2_ + sVar132) - (ushort)bVar150;
      auVar220._10_2_ = (auVar195._10_2_ + sVar135) - (ushort)bVar151;
      auVar220._12_2_ = (auVar195._12_2_ + sVar138) - (ushort)bVar152;
      auVar220._14_2_ = (auVar195._14_2_ + sVar141) - (ushort)bVar153;
      auVar185 = pabsw(auVar220,auVar220);
      auVar207._0_2_ = (auVar195._0_2_ + sVar120) - sVar180;
      auVar207._2_2_ = (auVar195._2_2_ + sVar129) - sVar181;
      auVar207._4_2_ = (auVar195._4_2_ + sVar130) - sVar180;
      auVar207._6_2_ = (auVar195._6_2_ + sVar131) - sVar181;
      auVar207._8_2_ = (auVar195._8_2_ + sVar132) - sVar180;
      auVar207._10_2_ = (auVar195._10_2_ + sVar135) - sVar181;
      auVar207._12_2_ = (auVar195._12_2_ + sVar138) - sVar180;
      auVar207._14_2_ = (auVar195._14_2_ + sVar141) - sVar181;
      auVar172 = pabsw(auVar207,auVar207);
      local_158 = auVar127._0_2_;
      sStack_156 = auVar127._2_2_;
      sStack_154 = auVar127._4_2_;
      sStack_152 = auVar127._6_2_;
      sStack_150 = auVar127._8_2_;
      sStack_14e = auVar127._10_2_;
      sStack_14c = auVar127._12_2_;
      sStack_14a = auVar127._14_2_;
      auVar230._0_2_ = -(ushort)(auVar185._0_2_ < local_158);
      auVar230._2_2_ = -(ushort)(auVar185._2_2_ < sStack_156);
      auVar230._4_2_ = -(ushort)(auVar185._4_2_ < sStack_154);
      auVar230._6_2_ = -(ushort)(auVar185._6_2_ < sStack_152);
      auVar230._8_2_ = -(ushort)(auVar185._8_2_ < sStack_150);
      auVar230._10_2_ = -(ushort)(auVar185._10_2_ < sStack_14e);
      auVar230._12_2_ = -(ushort)(auVar185._12_2_ < sStack_14c);
      auVar230._14_2_ = -(ushort)(auVar185._14_2_ < sStack_14a);
      auVar118._0_2_ = -(ushort)(auVar172._0_2_ < local_158);
      auVar118._2_2_ = -(ushort)(auVar172._2_2_ < sStack_156);
      auVar118._4_2_ = -(ushort)(auVar172._4_2_ < sStack_154);
      auVar118._6_2_ = -(ushort)(auVar172._6_2_ < sStack_152);
      auVar118._8_2_ = -(ushort)(auVar172._8_2_ < sStack_150);
      auVar118._10_2_ = -(ushort)(auVar172._10_2_ < sStack_14e);
      auVar118._12_2_ = -(ushort)(auVar172._12_2_ < sStack_14c);
      auVar118._14_2_ = -(ushort)(auVar172._14_2_ < sStack_14a);
      auVar221._0_2_ = -(ushort)(auVar172._0_2_ < auVar185._0_2_);
      auVar221._2_2_ = -(ushort)(auVar172._2_2_ < auVar185._2_2_);
      auVar221._4_2_ = -(ushort)(auVar172._4_2_ < auVar185._4_2_);
      auVar221._6_2_ = -(ushort)(auVar172._6_2_ < auVar185._6_2_);
      auVar221._8_2_ = -(ushort)(auVar172._8_2_ < auVar185._8_2_);
      auVar221._10_2_ = -(ushort)(auVar172._10_2_ < auVar185._10_2_);
      auVar221._12_2_ = -(ushort)(auVar172._12_2_ < auVar185._12_2_);
      auVar221._14_2_ = -(ushort)(auVar172._14_2_ < auVar185._14_2_);
      auVar58._4_2_ = sVar180;
      auVar58._0_4_ = uVar116;
      auVar58._6_2_ = sVar181;
      auVar58._8_2_ = sVar180;
      auVar58._10_2_ = sVar181;
      auVar58._12_2_ = sVar180;
      auVar58._14_2_ = sVar181;
      auVar185 = ~(auVar192 | auVar219) & auVar128 |
                 (~auVar178 & auVar182 | auVar57 & auVar178) & (auVar192 | auVar219);
      auVar172 = ~(auVar118 | auVar230) & auVar128 |
                 (~auVar221 & auVar146 | auVar58 & auVar221) & (auVar118 | auVar230);
      sVar120 = auVar185._0_2_;
      sVar129 = auVar185._2_2_;
      sVar130 = auVar185._4_2_;
      sVar131 = auVar185._6_2_;
      sVar132 = auVar185._8_2_;
      sVar135 = auVar185._10_2_;
      sVar138 = auVar185._12_2_;
      sVar141 = auVar185._14_2_;
      sVar28 = auVar172._0_2_;
      sVar32 = auVar172._2_2_;
      sVar36 = auVar172._4_2_;
      sVar40 = auVar172._6_2_;
      sVar44 = auVar172._8_2_;
      sVar48 = auVar172._10_2_;
      sVar52 = auVar172._12_2_;
      sVar56 = auVar172._14_2_;
      *dst = (0 < sVar1) * (sVar1 < 0x100) * auVar197[0] - (0xff < sVar1);
      dst[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar197[2] - (0xff < sVar4);
      dst[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar197[4] - (0xff < sVar7);
      dst[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar197[6] - (0xff < sVar10);
      dst[4] = (0 < sVar13) * (sVar13 < 0x100) * auVar197[8] - (0xff < sVar13);
      dst[5] = (0 < sVar16) * (sVar16 < 0x100) * auVar197[10] - (0xff < sVar16);
      dst[6] = (0 < sVar19) * (sVar19 < 0x100) * auVar197[0xc] - (0xff < sVar19);
      dst[7] = (0 < sVar22) * (sVar22 < 0x100) * auVar197[0xe] - (0xff < sVar22);
      dst[8] = (0 < sVar25) * (sVar25 < 0x100) * auVar200[0] - (0xff < sVar25);
      dst[9] = (0 < sVar29) * (sVar29 < 0x100) * auVar200[2] - (0xff < sVar29);
      dst[10] = (0 < sVar33) * (sVar33 < 0x100) * auVar200[4] - (0xff < sVar33);
      dst[0xb] = (0 < sVar37) * (sVar37 < 0x100) * auVar200[6] - (0xff < sVar37);
      dst[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar200[8] - (0xff < sVar41);
      dst[0xd] = (0 < sVar45) * (sVar45 < 0x100) * auVar200[10] - (0xff < sVar45);
      dst[0xe] = (0 < sVar49) * (sVar49 < 0x100) * auVar200[0xc] - (0xff < sVar49);
      dst[0xf] = (0 < sVar53) * (sVar53 < 0x100) * auVar200[0xe] - (0xff < sVar53);
      dst[0x10] = (0 < sVar2) * (sVar2 < 0x100) * auVar212[0] - (0xff < sVar2);
      dst[0x11] = (0 < sVar5) * (sVar5 < 0x100) * auVar212[2] - (0xff < sVar5);
      dst[0x12] = (0 < sVar8) * (sVar8 < 0x100) * auVar212[4] - (0xff < sVar8);
      dst[0x13] = (0 < sVar11) * (sVar11 < 0x100) * auVar212[6] - (0xff < sVar11);
      dst[0x14] = (0 < sVar14) * (sVar14 < 0x100) * auVar212[8] - (0xff < sVar14);
      dst[0x15] = (0 < sVar17) * (sVar17 < 0x100) * auVar212[10] - (0xff < sVar17);
      dst[0x16] = (0 < sVar20) * (sVar20 < 0x100) * auVar212[0xc] - (0xff < sVar20);
      dst[0x17] = (0 < sVar23) * (sVar23 < 0x100) * auVar212[0xe] - (0xff < sVar23);
      dst[0x18] = (0 < sVar26) * (sVar26 < 0x100) * auVar217[0] - (0xff < sVar26);
      dst[0x19] = (0 < sVar30) * (sVar30 < 0x100) * auVar217[2] - (0xff < sVar30);
      dst[0x1a] = (0 < sVar34) * (sVar34 < 0x100) * auVar217[4] - (0xff < sVar34);
      dst[0x1b] = (0 < sVar38) * (sVar38 < 0x100) * auVar217[6] - (0xff < sVar38);
      dst[0x1c] = (0 < sVar42) * (sVar42 < 0x100) * auVar217[8] - (0xff < sVar42);
      dst[0x1d] = (0 < sVar46) * (sVar46 < 0x100) * auVar217[10] - (0xff < sVar46);
      dst[0x1e] = (0 < sVar50) * (sVar50 < 0x100) * auVar217[0xc] - (0xff < sVar50);
      dst[0x1f] = (0 < sVar54) * (sVar54 < 0x100) * auVar217[0xe] - (0xff < sVar54);
      dst[0x20] = (0 < sVar3) * (sVar3 < 0x100) * auVar227[0] - (0xff < sVar3);
      dst[0x21] = (0 < sVar6) * (sVar6 < 0x100) * auVar227[2] - (0xff < sVar6);
      dst[0x22] = (0 < sVar9) * (sVar9 < 0x100) * auVar227[4] - (0xff < sVar9);
      dst[0x23] = (0 < sVar12) * (sVar12 < 0x100) * auVar227[6] - (0xff < sVar12);
      dst[0x24] = (0 < sVar15) * (sVar15 < 0x100) * auVar227[8] - (0xff < sVar15);
      dst[0x25] = (0 < sVar18) * (sVar18 < 0x100) * auVar227[10] - (0xff < sVar18);
      dst[0x26] = (0 < sVar21) * (sVar21 < 0x100) * auVar227[0xc] - (0xff < sVar21);
      dst[0x27] = (0 < sVar24) * (sVar24 < 0x100) * auVar227[0xe] - (0xff < sVar24);
      dst[0x28] = (0 < sVar27) * (sVar27 < 0x100) * auVar229[0] - (0xff < sVar27);
      dst[0x29] = (0 < sVar31) * (sVar31 < 0x100) * auVar229[2] - (0xff < sVar31);
      dst[0x2a] = (0 < sVar35) * (sVar35 < 0x100) * auVar229[4] - (0xff < sVar35);
      dst[0x2b] = (0 < sVar39) * (sVar39 < 0x100) * auVar229[6] - (0xff < sVar39);
      dst[0x2c] = (0 < sVar43) * (sVar43 < 0x100) * auVar229[8] - (0xff < sVar43);
      dst[0x2d] = (0 < sVar47) * (sVar47 < 0x100) * auVar229[10] - (0xff < sVar47);
      dst[0x2e] = (0 < sVar51) * (sVar51 < 0x100) * auVar229[0xc] - (0xff < sVar51);
      dst[0x2f] = (0 < sVar55) * (sVar55 < 0x100) * auVar229[0xe] - (0xff < sVar55);
      dst[0x30] = (0 < sVar120) * (sVar120 < 0x100) * auVar185[0] - (0xff < sVar120);
      dst[0x31] = (0 < sVar129) * (sVar129 < 0x100) * auVar185[2] - (0xff < sVar129);
      dst[0x32] = (0 < sVar130) * (sVar130 < 0x100) * auVar185[4] - (0xff < sVar130);
      dst[0x33] = (0 < sVar131) * (sVar131 < 0x100) * auVar185[6] - (0xff < sVar131);
      dst[0x34] = (0 < sVar132) * (sVar132 < 0x100) * auVar185[8] - (0xff < sVar132);
      dst[0x35] = (0 < sVar135) * (sVar135 < 0x100) * auVar185[10] - (0xff < sVar135);
      dst[0x36] = (0 < sVar138) * (sVar138 < 0x100) * auVar185[0xc] - (0xff < sVar138);
      dst[0x37] = (0 < sVar141) * (sVar141 < 0x100) * auVar185[0xe] - (0xff < sVar141);
      dst[0x38] = (0 < sVar28) * (sVar28 < 0x100) * auVar172[0] - (0xff < sVar28);
      dst[0x39] = (0 < sVar32) * (sVar32 < 0x100) * auVar172[2] - (0xff < sVar32);
      dst[0x3a] = (0 < sVar36) * (sVar36 < 0x100) * auVar172[4] - (0xff < sVar36);
      dst[0x3b] = (0 < sVar40) * (sVar40 < 0x100) * auVar172[6] - (0xff < sVar40);
      dst[0x3c] = (0 < sVar44) * (sVar44 < 0x100) * auVar172[8] - (0xff < sVar44);
      dst[0x3d] = (0 < sVar48) * (sVar48 < 0x100) * auVar172[10] - (0xff < sVar48);
      dst[0x3e] = (0 < sVar52) * (sVar52 < 0x100) * auVar172[0xc] - (0xff < sVar52);
      dst[0x3f] = (0 < sVar56) * (sVar56 < 0x100) * auVar172[0xe] - (0xff < sVar56);
      dst = dst + stride;
      auVar128._0_2_ = auVar145._0_2_ + 1;
      auVar128._2_2_ = auVar145._2_2_ + 1;
      auVar128._4_2_ = auVar145._4_2_ + 1;
      auVar128._6_2_ = auVar145._6_2_ + 1;
      auVar128._8_2_ = auVar145._8_2_ + 1;
      auVar128._10_2_ = auVar145._10_2_ + 1;
      auVar128._12_2_ = auVar145._12_2_ + 1;
      auVar128._14_2_ = auVar145._14_2_ + 1;
      iVar114 = iVar114 + -1;
      auVar145 = auVar128;
    } while (iVar114 != 0);
    lVar115 = 0x10;
    bVar112 = false;
  } while (bVar113);
  return;
}

Assistant:

void aom_paeth_predictor_64x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 2; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
      const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
      const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);
      _mm_store_si128((__m128i *)(dst + 32), r2);
      _mm_store_si128((__m128i *)(dst + 48), r3);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}